

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::GetHorzDirection(TEdge *HorzEdge,Direction *Dir,cInt *Left,cInt *Right)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  TEdge *pTVar4;
  
  pTVar4 = (TEdge *)&HorzEdge->Top;
  lVar1 = (HorzEdge->Bot).X;
  lVar2 = (HorzEdge->Top).X;
  bVar3 = lVar1 < lVar2;
  if (lVar2 <= lVar1) {
    pTVar4 = HorzEdge;
    lVar1 = lVar2;
  }
  *Left = lVar1;
  *Right = (pTVar4->Bot).X;
  *Dir = (uint)bVar3;
  return;
}

Assistant:

void GetHorzDirection(TEdge& HorzEdge, Direction& Dir, cInt& Left, cInt& Right)
{
  if (HorzEdge.Bot.X < HorzEdge.Top.X)
  {
    Left = HorzEdge.Bot.X;
    Right = HorzEdge.Top.X;
    Dir = dLeftToRight;
  } else
  {
    Left = HorzEdge.Top.X;
    Right = HorzEdge.Bot.X;
    Dir = dRightToLeft;
  }
}